

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O2

V2f __thiscall
Imf_3_4::CubeMap::pixelPosition
          (CubeMap *this,CubeMapFace face,Box2i *dataWindow,V2f *positionInFace)

{
  V2f VVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar2;
  Box2i dwf;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  dataWindowForFace((CubeMap *)&local_28,face,dataWindow);
  *(undefined8 *)this = 0;
  fVar2 = extraout_XMM0_Da;
  switch(face) {
  case CUBEFACE_POS_X:
    fVar2 = (float)local_28 + positionInFace->y;
    break;
  case CUBEFACE_NEG_X:
    fVar2 = (float)local_20 - positionInFace->y;
    break;
  case CUBEFACE_POS_Y:
  case CUBEFACE_NEG_Z:
    fVar2 = (float)local_28 + positionInFace->x;
    goto LAB_00177201;
  case CUBEFACE_NEG_Y:
    *(float *)this = (float)local_28 + positionInFace->x;
    fVar2 = (float)local_24 + positionInFace->y;
    goto LAB_0017723b;
  case CUBEFACE_POS_Z:
    fVar2 = (float)local_20 - positionInFace->x;
LAB_00177201:
    *(float *)this = fVar2;
    fVar2 = (float)local_1c - positionInFace->y;
    goto LAB_0017723b;
  default:
    goto switchD_001771cc_default;
  }
  *(float *)this = fVar2;
  fVar2 = (float)local_1c - positionInFace->x;
LAB_0017723b:
  *(float *)(this + 4) = fVar2;
switchD_001771cc_default:
  VVar1.y = extraout_XMM0_Db;
  VVar1.x = fVar2;
  return VVar1;
}

Assistant:

V2f
pixelPosition (CubeMapFace face, const Box2i& dataWindow, V2f positionInFace)
{
    Box2i dwf = dataWindowForFace (face, dataWindow);
    V2f   pos (0, 0);

    switch (face)
    {
        case CUBEFACE_POS_X:

            pos.x = dwf.min.x + positionInFace.y;
            pos.y = dwf.max.y - positionInFace.x;
            break;

        case CUBEFACE_NEG_X:

            pos.x = dwf.max.x - positionInFace.y;
            pos.y = dwf.max.y - positionInFace.x;
            break;

        case CUBEFACE_POS_Y:

            pos.x = dwf.min.x + positionInFace.x;
            pos.y = dwf.max.y - positionInFace.y;
            break;

        case CUBEFACE_NEG_Y:

            pos.x = dwf.min.x + positionInFace.x;
            pos.y = dwf.min.y + positionInFace.y;
            break;

        case CUBEFACE_POS_Z:

            pos.x = dwf.max.x - positionInFace.x;
            pos.y = dwf.max.y - positionInFace.y;
            break;

        case CUBEFACE_NEG_Z:

            pos.x = dwf.min.x + positionInFace.x;
            pos.y = dwf.max.y - positionInFace.y;
            break;
    }

    return pos;
}